

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isodate17_valid(uchar *v)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int gmt_off;
  int hundredths;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  int i;
  uchar *v_local;
  
  month = 0;
  while( true ) {
    if (0xf < month) {
      iVar2 = (*v - 0x30) * 1000 + (v[1] - 0x30) * 100 + (v[2] - 0x30) * 10 + (v[3] - 0x30);
      iVar3 = (v[4] - 0x30) * 10 + (v[5] - 0x30);
      iVar4 = (v[6] - 0x30) * 10 + (v[7] - 0x30);
      iVar5 = (v[8] - 0x30) * 10 + (v[9] - 0x30);
      iVar6 = (v[10] - 0x30) * 10 + (v[0xb] - 0x30);
      iVar7 = (v[0xc] - 0x30) * 10 + (v[0xd] - 0x30);
      iVar8 = (v[0xe] - 0x30) * 10 + (v[0xf] - 0x30);
      uVar1 = v[0x10];
      if (((((iVar2 == 0) && (iVar3 == 0)) && (iVar4 == 0)) && ((iVar5 == 0 && (iVar6 == 0)))) &&
         ((iVar7 == 0 && ((iVar8 == 0 && (uVar1 == '\0')))))) {
        v_local._4_4_ = 0;
      }
      else if ((iVar2 < 0x76c) || (0x8fc < iVar2)) {
        v_local._4_4_ = 0;
      }
      else if ((iVar3 < 1) || (0xc < iVar3)) {
        v_local._4_4_ = 0;
      }
      else if ((iVar4 < 1) || (0x1f < iVar4)) {
        v_local._4_4_ = 0;
      }
      else if (iVar5 < 0x18) {
        if (iVar6 < 0x3c) {
          if (iVar7 < 0x3e) {
            if (iVar8 < 100) {
              if (((char)uVar1 < -0x30) || ('4' < (char)uVar1)) {
                v_local._4_4_ = 0;
              }
              else {
                v_local._4_4_ = 1;
              }
            }
            else {
              v_local._4_4_ = 0;
            }
          }
          else {
            v_local._4_4_ = 0;
          }
        }
        else {
          v_local._4_4_ = 0;
        }
      }
      else {
        v_local._4_4_ = 0;
      }
      return v_local._4_4_;
    }
    if ((v[month] < 0x30) || (0x39 < v[month])) break;
    month = month + 1;
  }
  return 0;
}

Assistant:

static int
isodate17_valid(const unsigned char *v)
{
	/* First 16 bytes are all ASCII digits */
	for (int i = 0; i < 16; i++) {
		if (v[i] < '0' || v[i] > '9')
			return 0;
	}

	int year = (v[0] - '0') * 1000 + (v[1] - '0') * 100
		+ (v[2] - '0') * 10 + (v[3] - '0');
	int month = (v[4] - '0') * 10 + (v[5] - '0');
	int day = (v[6] - '0') * 10 + (v[7] - '0');
	int hour = (v[8] - '0') * 10 + (v[9] - '0');
	int minute = (v[10] - '0') * 10 + (v[11] - '0');
	int second = (v[12] - '0') * 10 + (v[13] - '0');
	int hundredths = (v[14] - '0') * 10 + (v[15] - '0');
	int gmt_off = (signed char)v[16];

	if (year == 0 && month == 0 && day == 0
	    && hour == 0 && minute == 0 && second == 0
	    && hundredths == 0 && gmt_off == 0)
		return 0;
	/*
	 * Sanity-test each individual field
	 */

	/* Year must be 1900-2300 */
	/* (Not specified in ECMA-119, but these seem
	   like reasonable limits. */
	if (year < 1900 || year > 2300)
		return 0;
	/* Month must be 1-12 */
	if (month < 1 || month > 12)
		return 0;
	/* Day must be 1-31 */
	if (day < 1 || day > 31)
		return 0;
	/* Hour must be 0-23 */
	if (hour > 23)
		return 0;
	/* Minute must be 0-59 */
	if (minute > 59)
		return 0;
	/* second must be 0-59 according to ECMA-119 9.1.5 */
	/* BUT: we should probably allow for the time being in UTC, which
	   allows up to 61 seconds in a minute in certain cases */
	if (second > 61)
		return 0;
	/* Hundredths must be 0-99 */
	if (hundredths > 99)
		return 0;
	/* Offset from GMT must be -48 to +52 */
	if (gmt_off < -48 || gmt_off > +52)
		return 0;

	/* All tests pass, this is OK */
	return 1;

}